

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O2

void MainWindowDetails::Proc
               (Display *param_1,Window *param_2,XEvent e,Size2D *size,bool *isResizing)

{
  int iStack_8;
  
  switch(e.type) {
  case 4:
    switch(e.xkey.keycode) {
    case 1:
      ProcRelay::mouse_left_down((ProcRelay *)relay);
      return;
    case 2:
      ProcRelay::mouse_middle_down((ProcRelay *)relay);
      return;
    case 3:
      ProcRelay::mouse_right_down((ProcRelay *)relay);
      return;
    case 4:
      iStack_8 = 1;
      break;
    case 5:
      iStack_8 = -1;
      break;
    default:
      goto switchD_0010f7fb_caseD_7;
    }
    ProcRelay::mouse_z((ProcRelay *)relay,iStack_8);
    return;
  case 5:
    if (e.xkey.keycode == 3) {
      ProcRelay::mouse_right_up((ProcRelay *)relay);
      return;
    }
    if (e.xkey.keycode == 2) {
      ProcRelay::mouse_middle_up((ProcRelay *)relay);
      return;
    }
    if (e.xkey.keycode == 1) {
      ProcRelay::mouse_left_up((ProcRelay *)relay);
      return;
    }
    break;
  case 6:
    ProcRelay::mouse_xy((ProcRelay *)relay,e.xkey.x,e.xkey.y);
    return;
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
    break;
  case 0xc:
    std::function<void_()>::operator()((function<void_()> *)(relay + 0x18));
    return;
  default:
    if ((e.type == 0x16) &&
       ((*(int *)param_1 != e.xexpose.count ||
        (*(int *)(param_1 + 4) != e.xgraphicsexpose.major_code)))) {
      *(undefined1 *)param_2 = 1;
      std::function<void_(int,_int,_StateChange)>::operator()
                ((function<void_(int,_int,_StateChange)> *)(relay + 0x38),e.xexpose.count,
                 e.xgraphicsexpose.major_code,Resized);
      return;
    }
  }
switchD_0010f7fb_caseD_7:
  return;
}

Assistant:

static void Proc(Display* /*display*/, Window& /*handle*/, XEvent e, Size2D const& size, bool& isResizing)
	{
		switch(e.type)
		{
		case MotionNotify: relay.mouse_xy(e.xbutton.x, e.xbutton.y); break;
		case EnterNotify:  break;
		case LeaveNotify:  break;
		case ButtonPress:
		{
			switch(e.xbutton.button)
			{
			case 1: relay.mouse_left_down();   break;
			case 2: relay.mouse_middle_down(); break;
			case 3: relay.mouse_right_down();  break;
			case 4: relay.mouse_z(1);          break;
			case 5: relay.mouse_z(-1);         break;
			}
			break;
		}
		case ButtonRelease:
		{
			switch(e.xbutton.button)
			{
			case 1: relay.mouse_left_up();   break;
			case 2: relay.mouse_middle_up(); break;
			case 3: relay.mouse_right_up();  break;
				//case 4: relay.mouse_z(1);          break;//?
				//case 5: relay.mouse_z(-1)          break;//?
			}
			break;
		}
		case ResizeRequest:
		{
			//XResizeRequestEvent re = e.xresizerequest;
			//printf("RR\n");
			break;
		}
		case ConfigureRequest:
		{
			//XConfigureRequestEvent re = e.xconfigurerequest;
			//printf("CR\n");
			break;
		}
		case ConfigureNotify:
		{
			XConfigureEvent re = e.xconfigure;
			if( size.w == re.width && size.h == re.height )
			{
				//printf("CN Move %i %i\n", re.x, re.y);
				//XMoveWindow(display, handle, 0, 0);
			}//move only
			else
			{
				isResizing = true;
				//printf("CN Resize %i %i\n", re.width, re.height);
				relay.onResize(re.width, re.height, StateChange::Resized);
			}
			break;
		}
		//CM handled outside.
		case Expose: relay.onRender(); break;
		}
	}